

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpEmpty
               (OpCode op,OpLayoutEmpty *data,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  PropertyIdArray *pPVar1;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar2;
  PropertyRecord *pPropertyName;
  uint i;
  ScriptContext *scriptContext;
  PropertyIdArray *propIds;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutEmpty *data_local;
  OpCode op_local;
  
  if (op == CommitScope) {
    pPVar1 = FunctionBody::GetFormalsPropIdArray(dumpFunction,true);
    this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
    Output::Print(L" %d [",(ulong)pPVar1->count);
    for (pPropertyName._4_4_ = 0; pPropertyName._4_4_ < pPVar1->count && pPropertyName._4_4_ < 3;
        pPropertyName._4_4_ = pPropertyName._4_4_ + 1) {
      this_00 = ScriptContext::GetPropertyName(this,(&pPVar1[1].count)[pPropertyName._4_4_]);
      if (pPropertyName._4_4_ != 0) {
        Output::Print(L", ");
      }
      pcVar2 = PropertyRecord::GetBuffer(this_00);
      Output::Print(L"%s",pcVar2);
    }
    Output::Print(L"]");
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpEmpty(OpCode op, const unaligned OpLayoutEmpty * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::CommitScope:
            {
                const Js::PropertyIdArray *propIds = dumpFunction->GetFormalsPropIdArray();
                ScriptContext* scriptContext = dumpFunction->GetScriptContext();
                Output::Print(_u(" %d ["), propIds->count);
                for (uint i = 0; i < propIds->count && i < 3; i++)
                {
                    PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propIds->elements[i]);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), pPropertyName->GetBuffer());
                }
                Output::Print(_u("]"));
                break;
            }
        }
    }